

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wirehair.cpp
# Opt level: O0

WirehairCodec
wirehair_decoder_create(WirehairCodec reuseOpt,uint64_t messageBytes,uint32_t blockBytes)

{
  WirehairResult WVar1;
  Codec *this;
  int in_EDX;
  long in_RSI;
  Codec *in_RDI;
  WirehairResult result;
  Codec *codec;
  undefined8 in_stack_ffffffffffffffa8;
  uint32_t block_bytes;
  Codec *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Codec *local_28;
  Codec *local_8;
  
  block_bytes = (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (((m_init) && (in_RSI != 0)) && (in_EDX != 0)) {
    local_28 = in_RDI;
    if (in_RDI == (Codec *)0x0) {
      this = (Codec *)operator_new(0x100,(nothrow_t *)&std::nothrow);
      in_stack_ffffffffffffffb0 = (Codec *)0x0;
      if (this != (Codec *)0x0) {
        wirehair::Codec::Codec(this);
        in_stack_ffffffffffffffb0 = this;
      }
      block_bytes = (uint32_t)((ulong)this >> 0x20);
      local_28 = in_stack_ffffffffffffffb0;
    }
    WVar1 = wirehair::Codec::InitializeDecoder
                      ((Codec *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (uint64_t)in_stack_ffffffffffffffb0,block_bytes);
    if (WVar1 != Wirehair_Success) {
      if (local_28 != (Codec *)0x0) {
        wirehair::Codec::~Codec(local_28);
        operator_delete(local_28);
      }
      local_28 = (Codec *)0x0;
    }
    local_8 = local_28;
  }
  else {
    local_8 = (Codec *)0x0;
  }
  return (WirehairCodec)local_8;
}

Assistant:

WIREHAIR_EXPORT WirehairCodec wirehair_decoder_create(
    WirehairCodec reuseOpt, ///< Codec object to reuse
    uint64_t  messageBytes, ///< Bytes in the message to decode
    uint32_t    blockBytes  ///< Bytes in each encoded block
)
{
    // If input is invalid:
    if (!m_init || messageBytes < 1 || blockBytes < 1) {
        return nullptr;
    }

    wirehair::Codec* codec = reinterpret_cast<wirehair::Codec*>(reuseOpt);

    // Allocate a new Codec object
    if (!codec) {
        codec = new (std::nothrow) wirehair::Codec;
    }

    // Allocate memory for decoding
    WirehairResult result = codec->InitializeDecoder(messageBytes, blockBytes);

    // If either function failed:
    if (result != Wirehair_Success)
    {
        // Note this will also release the reuse parameter
        delete codec;
        codec = nullptr;
    }

    return reinterpret_cast<WirehairCodec>(codec);
}